

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::PrecisionCase
          (PrecisionCase *this,Context *context,string *name,string *extension)

{
  char *name_00;
  int iVar1;
  
  name_00 = (name->_M_dataplus)._M_p;
  tcu::TestCase::TestCase(&this->super_TestCase,context->testContext,name_00,name_00);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__PrecisionCase_00c2e268;
  Context::Context(&this->m_ctx,context);
  tcu::ResultCollector::ResultCollector(&this->m_status);
  iVar1 = tcu::CommandLine::getBaseSeed(context->testContext->m_cmdLine);
  deRandom_init(&(this->m_rnd).m_rnd,iVar1 + 0xdeadbeef);
  std::__cxx11::string::string((string *)&this->m_extension,(string *)extension);
  return;
}

Assistant:

PrecisionCase	(const Context&		context,
										 const string&		name,
										 const string&		extension	= "")
							: TestCase		(context.testContext,
											 name.c_str(),
											 name.c_str())
							, m_ctx			(context)
							, m_status		()
							, m_rnd			(0xdeadbeefu +
											 context.testContext.getCommandLine().getBaseSeed())
							, m_extension	(extension)
	{
	}